

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::BVHNIntersector1<8,_257,_false,_embree::avx512::VirtualCurveIntersector1>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  bool bVar8;
  undefined1 auVar9 [32];
  undefined8 uVar10;
  long lVar11;
  undefined1 auVar12 [12];
  undefined1 auVar13 [32];
  char cVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  ulong *puVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 extraout_var [56];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  float fVar48;
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  vfloat4 a0;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  Precalculations pre;
  NodeRef stack [564];
  float local_1218 [4];
  undefined1 local_1208 [16];
  undefined1 local_11f8 [16];
  undefined1 local_11e8 [16];
  ulong local_11d8;
  ulong local_11d0 [564];
  
  local_11d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8 != 8) {
    fVar1 = ray->tfar;
    auVar42 = ZEXT464((uint)fVar1);
    auVar44 = ZEXT1664(ZEXT816(0) << 0x40);
    if (0.0 <= fVar1) {
      aVar7 = (ray->dir).field_0.field_1;
      auVar54 = vdpps_avx((undefined1  [16])aVar7,(undefined1  [16])aVar7,0x7f);
      auVar12 = ZEXT812(0) << 0x20;
      auVar50 = ZEXT816(0) << 0x40;
      auVar53._4_12_ = auVar12;
      auVar53._0_4_ = auVar54._0_4_;
      auVar23 = vrsqrt14ss_avx512f(auVar50,auVar53);
      fVar52 = auVar23._0_4_;
      uVar2 = *(undefined4 *)&(ray->dir).field_0;
      local_1218[0] = fVar52 * 1.5 - auVar54._0_4_ * 0.5 * fVar52 * fVar52 * fVar52;
      uVar3 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      fVar52 = (ray->dir).field_0.m128[2];
      auVar57._0_4_ = aVar7.x * local_1218[0];
      auVar57._4_4_ = aVar7.y * local_1218[0];
      auVar57._8_4_ = aVar7.z * local_1218[0];
      auVar57._12_4_ = aVar7.field_3.w * local_1218[0];
      auVar23 = vshufpd_avx(auVar57,auVar57,1);
      auVar54 = vmovshdup_avx(auVar57);
      auVar46._8_4_ = 0x80000000;
      auVar46._0_8_ = 0x8000000080000000;
      auVar46._12_4_ = 0x80000000;
      auVar35._16_4_ = 0x80000000;
      auVar35._0_16_ = auVar46;
      auVar35._20_4_ = 0x80000000;
      auVar35._24_4_ = 0x80000000;
      auVar35._28_4_ = 0x80000000;
      auVar60._0_4_ = auVar54._0_4_ ^ 0x80000000;
      auVar54 = vunpckhps_avx(auVar57,auVar50);
      auVar60._4_12_ = auVar12;
      auVar26 = vshufps_avx(auVar54,auVar60,0x41);
      auVar58._0_8_ = auVar23._0_8_ ^ 0x8000000080000000;
      auVar58._8_8_ = auVar23._8_8_ ^ auVar46._8_8_;
      auVar25 = vinsertps_avx(auVar58,auVar57,0x2a);
      auVar54 = vdpps_avx(auVar26,auVar26,0x7f);
      auVar23 = vdpps_avx(auVar25,auVar25,0x7f);
      uVar10 = vcmpps_avx512vl(auVar23,auVar54,1);
      auVar54 = vpmovm2d_avx512vl(uVar10);
      auVar61._0_4_ = auVar54._0_4_;
      auVar61._4_4_ = auVar61._0_4_;
      auVar61._8_4_ = auVar61._0_4_;
      auVar61._12_4_ = auVar61._0_4_;
      uVar22 = vpmovd2m_avx512vl(auVar61);
      auVar54 = vpcmpeqd_avx(auVar61,auVar61);
      auVar24._4_4_ = (uint)((byte)(uVar22 >> 1) & 1) * auVar54._4_4_;
      auVar24._0_4_ = (uint)((byte)uVar22 & 1) * auVar54._0_4_;
      auVar24._8_4_ = (uint)((byte)(uVar22 >> 2) & 1) * auVar54._8_4_;
      auVar24._12_4_ = (uint)((byte)(uVar22 >> 3) & 1) * auVar54._12_4_;
      auVar54 = vblendvps_avx(auVar25,auVar26,auVar24);
      auVar23 = vdpps_avx(auVar54,auVar54,0x7f);
      auVar62._4_12_ = auVar12;
      auVar62._0_4_ = auVar23._0_4_;
      auVar25 = vrsqrt14ss_avx512f(auVar50,auVar62);
      fVar48 = auVar25._0_4_;
      fVar48 = fVar48 * 1.5 - auVar23._0_4_ * 0.5 * fVar48 * fVar48 * fVar48;
      auVar59._0_4_ = auVar54._0_4_ * fVar48;
      auVar59._4_4_ = auVar54._4_4_ * fVar48;
      auVar59._8_4_ = auVar54._8_4_ * fVar48;
      auVar59._12_4_ = auVar54._12_4_ * fVar48;
      auVar54 = vshufps_avx(auVar59,auVar59,0xc9);
      auVar23 = vshufps_avx(auVar57,auVar57,0xc9);
      auVar63._0_4_ = auVar59._0_4_ * auVar23._0_4_;
      auVar63._4_4_ = auVar59._4_4_ * auVar23._4_4_;
      auVar63._8_4_ = auVar59._8_4_ * auVar23._8_4_;
      auVar63._12_4_ = auVar59._12_4_ * auVar23._12_4_;
      auVar54 = vfmsub231ps_fma(auVar63,auVar57,auVar54);
      auVar23 = vshufps_avx(auVar54,auVar54,0xc9);
      auVar54 = vdpps_avx(auVar23,auVar23,0x7f);
      auVar64._4_12_ = auVar12;
      auVar64._0_4_ = auVar54._0_4_;
      auVar25 = vrsqrt14ss_avx512f(auVar50,auVar64);
      fVar48 = auVar25._0_4_;
      fVar48 = fVar48 * 1.5 - auVar54._0_4_ * 0.5 * fVar48 * fVar48 * fVar48;
      auVar56._0_4_ = auVar23._0_4_ * fVar48;
      auVar56._4_4_ = auVar23._4_4_ * fVar48;
      auVar56._8_4_ = auVar23._8_4_ * fVar48;
      auVar56._12_4_ = auVar23._12_4_ * fVar48;
      auVar54._0_4_ = local_1218[0] * auVar57._0_4_;
      auVar54._4_4_ = local_1218[0] * auVar57._4_4_;
      auVar54._8_4_ = local_1218[0] * auVar57._8_4_;
      auVar54._12_4_ = local_1218[0] * auVar57._12_4_;
      auVar25 = vunpcklps_avx(auVar59,auVar54);
      auVar54 = vunpckhps_avx(auVar59,auVar54);
      auVar26 = vunpcklps_avx(auVar56,auVar50);
      auVar23 = vunpckhps_avx(auVar56,auVar50);
      local_11e8 = vunpcklps_avx(auVar54,auVar23);
      local_1208 = vunpcklps_avx(auVar25,auVar26);
      local_11f8 = vunpckhps_avx(auVar25,auVar26);
      puVar19 = local_11d0;
      auVar54 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar23._8_4_ = 0x7fffffff;
      auVar23._0_8_ = 0x7fffffff7fffffff;
      auVar23._12_4_ = 0x7fffffff;
      auVar23 = vandps_avx512vl((undefined1  [16])aVar7,auVar23);
      auVar50._8_4_ = 0x219392ef;
      auVar50._0_8_ = 0x219392ef219392ef;
      auVar50._12_4_ = 0x219392ef;
      uVar22 = vcmpps_avx512vl(auVar23,auVar50,1);
      bVar8 = (bool)((byte)uVar22 & 1);
      auVar26._0_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * (int)aVar7.x;
      bVar8 = (bool)((byte)(uVar22 >> 1) & 1);
      auVar26._4_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * (int)aVar7.y;
      bVar8 = (bool)((byte)(uVar22 >> 2) & 1);
      auVar26._8_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * (int)aVar7.z;
      bVar8 = (bool)((byte)(uVar22 >> 3) & 1);
      auVar26._12_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * aVar7.field_3.a;
      auVar23 = vrcp14ps_avx512vl(auVar26);
      auVar25._8_4_ = 0x3f800000;
      auVar25._0_8_ = 0x3f8000003f800000;
      auVar25._12_4_ = 0x3f800000;
      auVar25 = vfnmadd213ps_avx512vl(auVar26,auVar23,auVar25);
      uVar4 = *(undefined4 *)&(ray->org).field_0;
      uVar5 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      auVar26 = vfmadd132ps_fma(auVar25,auVar23,auVar23);
      uVar6 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      auVar27 = vbroadcastss_avx512vl(auVar26);
      auVar23 = vmovshdup_avx(auVar26);
      auVar28 = vbroadcastsd_avx512vl(auVar23);
      auVar25 = vshufpd_avx(auVar26,auVar26,1);
      auVar30._8_4_ = 2;
      auVar30._0_8_ = 0x200000002;
      auVar30._12_4_ = 2;
      auVar30._16_4_ = 2;
      auVar30._20_4_ = 2;
      auVar30._24_4_ = 2;
      auVar30._28_4_ = 2;
      auVar29 = vpermps_avx512vl(auVar30,ZEXT1632(auVar26));
      fVar48 = auVar26._0_4_ * (ray->org).field_0.m128[0];
      auVar32._4_4_ = fVar48;
      auVar32._0_4_ = fVar48;
      auVar32._8_4_ = fVar48;
      auVar32._12_4_ = fVar48;
      auVar32._16_4_ = fVar48;
      auVar32._20_4_ = fVar48;
      auVar32._24_4_ = fVar48;
      auVar32._28_4_ = fVar48;
      auVar33._8_4_ = 1;
      auVar33._0_8_ = 0x100000001;
      auVar33._12_4_ = 1;
      auVar33._16_4_ = 1;
      auVar33._20_4_ = 1;
      auVar33._24_4_ = 1;
      auVar33._28_4_ = 1;
      auVar34 = ZEXT1632(CONCAT412(auVar26._12_4_ * (ray->org).field_0.m128[3],
                                   CONCAT48(auVar26._8_4_ * (ray->org).field_0.m128[2],
                                            CONCAT44(auVar26._4_4_ * (ray->org).field_0.m128[1],
                                                     fVar48))));
      auVar33 = vpermps_avx2(auVar33,auVar34);
      auVar34 = vpermps_avx2(auVar30,auVar34);
      uVar21 = (ulong)(auVar26._0_4_ < 0.0) * 0x20;
      uVar22 = (ulong)(auVar23._0_4_ < 0.0) << 5 | 0x40;
      uVar20 = (ulong)(auVar25._0_4_ < 0.0) << 5 | 0x80;
      auVar30 = vbroadcastss_avx512vl(auVar54);
      auVar31 = vbroadcastss_avx512vl(ZEXT416((uint)fVar1));
      auVar32 = vxorps_avx512vl(auVar32,auVar35);
      auVar33 = vxorps_avx512vl(auVar33,auVar35);
      auVar34 = vxorps_avx512vl(auVar34,auVar35);
LAB_01c52e04:
      if (puVar19 != &local_11d8) {
        uVar16 = puVar19[-1];
        puVar19 = puVar19 + -1;
LAB_01c52e15:
        if ((uVar16 & 0xf) == 0) {
          auVar35 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar16 + 0x40 + uVar21),auVar32,auVar27);
          auVar36 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar16 + 0x40 + uVar22),auVar33,auVar28);
          auVar35 = vpmaxsd_avx2(auVar35,auVar36);
          auVar37 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar16 + 0x40 + uVar20),auVar34,auVar29);
          auVar36 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar16 + 0x40 + (uVar21 ^ 0x20)),auVar32,
                               auVar27);
          auVar38 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar16 + 0x40 + (uVar22 ^ 0x20)),auVar33,
                               auVar28);
          auVar36 = vpminsd_avx2(auVar36,auVar38);
          auVar38 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar16 + 0x40 + (uVar20 ^ 0x20)),auVar34,
                               auVar29);
          auVar37 = vpmaxsd_avx512vl(auVar37,auVar30);
          auVar37 = vpmaxsd_avx2(auVar35,auVar37);
          auVar35 = vpminsd_avx512vl(auVar38,auVar31);
          auVar36 = vpminsd_avx2(auVar36,auVar35);
          uVar10 = vpcmpd_avx512vl(auVar37,auVar36,2);
          uVar17 = (uint)uVar10;
        }
        else {
          if ((int)(uVar16 & 0xf) != 2) {
            cVar14 = (**(code **)((long)This->leafIntersector +
                                 (ulong)*(byte *)(uVar16 & 0xfffffffffffffff0) * 0x40 + 8))
                               (local_1218,ray,context);
            auVar44._8_56_ = extraout_var_00;
            auVar44._0_8_ = extraout_XMM1_Qa;
            auVar42._8_56_ = extraout_var;
            auVar42._0_8_ = extraout_XMM0_Qa;
            if (cVar14 != '\0') {
              ray->tfar = -INFINITY;
              return;
            }
            goto LAB_01c52e04;
          }
          uVar18 = uVar16 & 0xfffffffffffffff0;
          auVar35 = *(undefined1 (*) [32])(uVar18 + 0x100);
          auVar43._0_4_ = fVar52 * auVar35._0_4_;
          auVar43._4_4_ = fVar52 * auVar35._4_4_;
          auVar43._8_4_ = fVar52 * auVar35._8_4_;
          auVar43._12_4_ = fVar52 * auVar35._12_4_;
          auVar43._16_4_ = fVar52 * auVar35._16_4_;
          auVar43._20_4_ = fVar52 * auVar35._20_4_;
          auVar43._28_36_ = auVar42._28_36_;
          auVar43._24_4_ = fVar52 * auVar35._24_4_;
          auVar36 = *(undefined1 (*) [32])(uVar18 + 0x120);
          auVar37 = *(undefined1 (*) [32])(uVar18 + 0x140);
          auVar45._0_4_ = fVar52 * auVar36._0_4_;
          auVar45._4_4_ = fVar52 * auVar36._4_4_;
          auVar45._8_4_ = fVar52 * auVar36._8_4_;
          auVar45._12_4_ = fVar52 * auVar36._12_4_;
          auVar45._16_4_ = fVar52 * auVar36._16_4_;
          auVar45._20_4_ = fVar52 * auVar36._20_4_;
          auVar45._28_36_ = auVar44._28_36_;
          auVar45._24_4_ = fVar52 * auVar36._24_4_;
          auVar38._4_4_ = fVar52 * auVar37._4_4_;
          auVar38._0_4_ = fVar52 * auVar37._0_4_;
          auVar38._8_4_ = fVar52 * auVar37._8_4_;
          auVar38._12_4_ = fVar52 * auVar37._12_4_;
          auVar38._16_4_ = fVar52 * auVar37._16_4_;
          auVar38._20_4_ = fVar52 * auVar37._20_4_;
          auVar38._24_4_ = fVar52 * auVar37._24_4_;
          auVar38._28_4_ = fVar52;
          auVar47._4_4_ = uVar3;
          auVar47._0_4_ = uVar3;
          auVar47._8_4_ = uVar3;
          auVar47._12_4_ = uVar3;
          auVar47._16_4_ = uVar3;
          auVar47._20_4_ = uVar3;
          auVar47._24_4_ = uVar3;
          auVar47._28_4_ = uVar3;
          auVar54 = vfmadd231ps_fma(auVar43._0_32_,auVar47,*(undefined1 (*) [32])(uVar18 + 0xa0));
          auVar23 = vfmadd231ps_fma(auVar45._0_32_,auVar47,*(undefined1 (*) [32])(uVar18 + 0xc0));
          auVar25 = vfmadd231ps_fma(auVar38,auVar47,*(undefined1 (*) [32])(uVar18 + 0xe0));
          auVar13._4_4_ = uVar2;
          auVar13._0_4_ = uVar2;
          auVar13._8_4_ = uVar2;
          auVar13._12_4_ = uVar2;
          auVar13._16_4_ = uVar2;
          auVar13._20_4_ = uVar2;
          auVar13._24_4_ = uVar2;
          auVar13._28_4_ = uVar2;
          auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),auVar13,*(undefined1 (*) [32])(uVar18 + 0x40))
          ;
          auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar13,*(undefined1 (*) [32])(uVar18 + 0x60))
          ;
          auVar25 = vfmadd231ps_fma(ZEXT1632(auVar25),auVar13,*(undefined1 (*) [32])(uVar18 + 0x80))
          ;
          auVar65._8_4_ = 0x7fffffff;
          auVar65._0_8_ = 0x7fffffff7fffffff;
          auVar65._12_4_ = 0x7fffffff;
          auVar65._16_4_ = 0x7fffffff;
          auVar65._20_4_ = 0x7fffffff;
          auVar65._24_4_ = 0x7fffffff;
          auVar65._28_4_ = 0x7fffffff;
          auVar38 = vandps_avx(auVar65,ZEXT1632(auVar54));
          auVar67._8_4_ = 0x219392ef;
          auVar67._0_8_ = 0x219392ef219392ef;
          auVar67._12_4_ = 0x219392ef;
          auVar67._16_4_ = 0x219392ef;
          auVar67._20_4_ = 0x219392ef;
          auVar67._24_4_ = 0x219392ef;
          auVar67._28_4_ = 0x219392ef;
          uVar15 = vcmpps_avx512vl(auVar38,auVar67,1);
          bVar8 = (bool)((byte)uVar15 & 1);
          auVar39._0_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar54._0_4_;
          bVar8 = (bool)((byte)(uVar15 >> 1) & 1);
          auVar39._4_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar54._4_4_;
          bVar8 = (bool)((byte)(uVar15 >> 2) & 1);
          auVar39._8_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar54._8_4_;
          bVar8 = (bool)((byte)(uVar15 >> 3) & 1);
          auVar39._12_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar54._12_4_;
          auVar39._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * 0x219392ef;
          auVar39._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * 0x219392ef;
          auVar39._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * 0x219392ef;
          auVar39._28_4_ = (uint)(byte)(uVar15 >> 7) * 0x219392ef;
          auVar38 = vandps_avx(auVar65,ZEXT1632(auVar23));
          uVar15 = vcmpps_avx512vl(auVar38,auVar67,1);
          bVar8 = (bool)((byte)uVar15 & 1);
          auVar40._0_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar23._0_4_;
          bVar8 = (bool)((byte)(uVar15 >> 1) & 1);
          auVar40._4_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar23._4_4_;
          bVar8 = (bool)((byte)(uVar15 >> 2) & 1);
          auVar40._8_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar23._8_4_;
          bVar8 = (bool)((byte)(uVar15 >> 3) & 1);
          auVar40._12_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar23._12_4_;
          auVar40._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * 0x219392ef;
          auVar40._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * 0x219392ef;
          auVar40._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * 0x219392ef;
          auVar40._28_4_ = (uint)(byte)(uVar15 >> 7) * 0x219392ef;
          auVar38 = vandps_avx(auVar65,ZEXT1632(auVar25));
          uVar15 = vcmpps_avx512vl(auVar38,auVar67,1);
          bVar8 = (bool)((byte)uVar15 & 1);
          auVar41._0_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar25._0_4_;
          bVar8 = (bool)((byte)(uVar15 >> 1) & 1);
          auVar41._4_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar25._4_4_;
          bVar8 = (bool)((byte)(uVar15 >> 2) & 1);
          auVar41._8_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar25._8_4_;
          bVar8 = (bool)((byte)(uVar15 >> 3) & 1);
          auVar41._12_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar25._12_4_;
          auVar41._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * 0x219392ef;
          auVar41._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * 0x219392ef;
          auVar41._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * 0x219392ef;
          auVar41._28_4_ = (uint)(byte)(uVar15 >> 7) * 0x219392ef;
          auVar38 = vrcp14ps_avx512vl(auVar39);
          auVar66._8_4_ = 0x3f800000;
          auVar66._0_8_ = 0x3f8000003f800000;
          auVar66._12_4_ = 0x3f800000;
          auVar66._16_4_ = 0x3f800000;
          auVar66._20_4_ = 0x3f800000;
          auVar66._24_4_ = 0x3f800000;
          auVar66._28_4_ = 0x3f800000;
          auVar54 = vfnmadd213ps_fma(auVar39,auVar38,auVar66);
          auVar54 = vfmadd132ps_fma(ZEXT1632(auVar54),auVar38,auVar38);
          auVar38 = vrcp14ps_avx512vl(auVar40);
          auVar23 = vfnmadd213ps_fma(auVar40,auVar38,auVar66);
          auVar23 = vfmadd132ps_fma(ZEXT1632(auVar23),auVar38,auVar38);
          auVar38 = vrcp14ps_avx512vl(auVar41);
          auVar25 = vfnmadd213ps_fma(auVar41,auVar38,auVar66);
          auVar25 = vfmadd132ps_fma(ZEXT1632(auVar25),auVar38,auVar38);
          auVar9._4_4_ = uVar6;
          auVar9._0_4_ = uVar6;
          auVar9._8_4_ = uVar6;
          auVar9._12_4_ = uVar6;
          auVar9._16_4_ = uVar6;
          auVar9._20_4_ = uVar6;
          auVar9._24_4_ = uVar6;
          auVar9._28_4_ = uVar6;
          auVar26 = vfmadd213ps_fma(auVar35,auVar9,*(undefined1 (*) [32])(uVar18 + 0x160));
          auVar24 = vfmadd213ps_fma(auVar36,auVar9,*(undefined1 (*) [32])(uVar18 + 0x180));
          auVar46 = vfmadd213ps_fma(auVar37,auVar9,*(undefined1 (*) [32])(uVar18 + 0x1a0));
          auVar36._4_4_ = uVar5;
          auVar36._0_4_ = uVar5;
          auVar36._8_4_ = uVar5;
          auVar36._12_4_ = uVar5;
          auVar36._16_4_ = uVar5;
          auVar36._20_4_ = uVar5;
          auVar36._24_4_ = uVar5;
          auVar36._28_4_ = uVar5;
          auVar26 = vfmadd231ps_fma(ZEXT1632(auVar26),auVar36,*(undefined1 (*) [32])(uVar18 + 0xa0))
          ;
          auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),auVar36,*(undefined1 (*) [32])(uVar18 + 0xc0))
          ;
          auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar36,*(undefined1 (*) [32])(uVar18 + 0xe0))
          ;
          auVar37._4_4_ = uVar4;
          auVar37._0_4_ = uVar4;
          auVar37._8_4_ = uVar4;
          auVar37._12_4_ = uVar4;
          auVar37._16_4_ = uVar4;
          auVar37._20_4_ = uVar4;
          auVar37._24_4_ = uVar4;
          auVar37._28_4_ = uVar4;
          auVar26 = vfmadd231ps_fma(ZEXT1632(auVar26),auVar37,*(undefined1 (*) [32])(uVar18 + 0x40))
          ;
          auVar55._0_4_ = -auVar54._0_4_ * auVar26._0_4_;
          auVar55._4_4_ = -auVar54._4_4_ * auVar26._4_4_;
          auVar55._8_4_ = -auVar54._8_4_ * auVar26._8_4_;
          auVar55._12_4_ = -auVar54._12_4_ * auVar26._12_4_;
          auVar55._16_4_ = 0x80000000;
          auVar55._20_4_ = 0x80000000;
          auVar55._24_4_ = 0x80000000;
          auVar55._28_4_ = 0;
          auVar26 = vfmadd231ps_fma(ZEXT1632(auVar24),auVar37,*(undefined1 (*) [32])(uVar18 + 0x60))
          ;
          auVar51._0_4_ = -auVar23._0_4_ * auVar26._0_4_;
          auVar51._4_4_ = -auVar23._4_4_ * auVar26._4_4_;
          auVar51._8_4_ = -auVar23._8_4_ * auVar26._8_4_;
          auVar51._12_4_ = -auVar23._12_4_ * auVar26._12_4_;
          auVar51._16_4_ = 0x80000000;
          auVar51._20_4_ = 0x80000000;
          auVar51._24_4_ = 0x80000000;
          auVar51._28_4_ = 0;
          auVar26 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar37,*(undefined1 (*) [32])(uVar18 + 0x80))
          ;
          auVar49._0_4_ = -auVar25._0_4_ * auVar26._0_4_;
          auVar49._4_4_ = -auVar25._4_4_ * auVar26._4_4_;
          auVar49._8_4_ = -auVar25._8_4_ * auVar26._8_4_;
          auVar49._12_4_ = -auVar25._12_4_ * auVar26._12_4_;
          auVar49._16_4_ = 0x80000000;
          auVar49._20_4_ = 0x80000000;
          auVar49._24_4_ = 0x80000000;
          auVar49._28_4_ = 0;
          auVar37 = ZEXT1632(CONCAT412(auVar54._12_4_ + auVar55._12_4_,
                                       CONCAT48(auVar54._8_4_ + auVar55._8_4_,
                                                CONCAT44(auVar54._4_4_ + auVar55._4_4_,
                                                         auVar54._0_4_ + auVar55._0_4_))));
          auVar38 = ZEXT1632(CONCAT412(auVar23._12_4_ + auVar51._12_4_,
                                       CONCAT48(auVar23._8_4_ + auVar51._8_4_,
                                                CONCAT44(auVar23._4_4_ + auVar51._4_4_,
                                                         auVar23._0_4_ + auVar51._0_4_))));
          auVar47 = ZEXT1632(CONCAT412(auVar25._12_4_ + auVar49._12_4_,
                                       CONCAT48(auVar25._8_4_ + auVar49._8_4_,
                                                CONCAT44(auVar25._4_4_ + auVar49._4_4_,
                                                         auVar25._0_4_ + auVar49._0_4_))));
          auVar9 = vpminsd_avx2(auVar55,auVar37);
          auVar35 = vpminsd_avx2(auVar51,auVar38);
          auVar36 = vpminsd_avx2(auVar49,auVar47);
          auVar35 = vmaxps_avx(auVar35,auVar36);
          auVar37 = vpmaxsd_avx2(auVar55,auVar37);
          auVar36 = vpmaxsd_avx2(auVar51,auVar38);
          auVar38 = vpmaxsd_avx2(auVar49,auVar47);
          auVar36 = vminps_avx(auVar36,auVar38);
          auVar38 = vmaxps_avx512vl(auVar30,auVar9);
          auVar35 = vmaxps_avx(auVar38,auVar35);
          auVar37 = vminps_avx512vl(auVar31,auVar37);
          auVar37 = vminps_avx(auVar37,auVar36);
          uVar10 = vcmpps_avx512vl(auVar35,auVar37,2);
          uVar17 = (uint)uVar10;
        }
        auVar44 = ZEXT3264(auVar36);
        auVar42 = ZEXT3264(auVar37);
        if ((byte)uVar17 == 0) goto LAB_01c52e04;
        uVar15 = uVar16 & 0xfffffffffffffff0;
        lVar11 = 0;
        for (uVar16 = (ulong)(byte)uVar17; (uVar16 & 1) == 0;
            uVar16 = uVar16 >> 1 | 0x8000000000000000) {
          lVar11 = lVar11 + 1;
        }
        uVar16 = *(ulong *)(uVar15 + lVar11 * 8);
        uVar17 = (uVar17 & 0xff) - 1 & uVar17 & 0xff;
        uVar18 = (ulong)uVar17;
        if (uVar17 != 0) {
          do {
            *puVar19 = uVar16;
            puVar19 = puVar19 + 1;
            lVar11 = 0;
            for (uVar16 = uVar18; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
              lVar11 = lVar11 + 1;
            }
            uVar18 = uVar18 - 1 & uVar18;
            uVar16 = *(ulong *)(uVar15 + lVar11 * 8);
          } while (uVar18 != 0);
        }
        goto LAB_01c52e15;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }